

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_mem.c
# Opt level: O3

amqp_pool_t * amqp_get_channel_pool(amqp_connection_state_t state,amqp_channel_t channel)

{
  amqp_pool_table_entry_t *paVar1;
  
  paVar1 = (amqp_pool_table_entry_t *)(state->pool_table + (channel & 0xf));
  do {
    paVar1 = paVar1->next;
    if (paVar1 == (amqp_pool_table_entry_t *)0x0) {
      return (amqp_pool_t *)0x0;
    }
  } while (paVar1->channel != channel);
  return &paVar1->pool;
}

Assistant:

amqp_pool_t *amqp_get_channel_pool(amqp_connection_state_t state, amqp_channel_t channel)
{
  amqp_pool_table_entry_t *entry;
  size_t index = channel % POOL_TABLE_SIZE;

  entry = state->pool_table[index];

  for ( ; NULL != entry; entry = entry->next) {
    if (channel == entry->channel) {
      return &entry->pool;
    }
  }

  return NULL;
}